

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O2

void __thiscall rtosc::UndoHistoryImpl::rewind(UndoHistoryImpl *this,FILE *__stream)

{
  char *pcVar1;
  rtosc_arg_t rVar2;
  rtosc_arg_t arg;
  
  memset(tmp,0,0x100);
  arg = rtosc_argument((char *)__stream,1);
  rVar2 = rtosc_argument((char *)__stream,0);
  pcVar1 = rtosc_argument_string((char *)__stream);
  rtosc_amessage(tmp,0x100,rVar2.s,pcVar1 + 2,&arg);
  std::function<void_(const_char_*)>::operator()(&this->cb,tmp);
  return;
}

Assistant:

void UndoHistoryImpl::rewind(const char *msg)
{
    memset(tmp, 0, sizeof(tmp));
    rtosc_arg_t arg = rtosc_argument(msg,1);
    rtosc_amessage(tmp, 256, rtosc_argument(msg,0).s,
            rtosc_argument_string(msg)+2,
            &arg);
    cb(tmp);
}